

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
vkt::shaderexecutor::Functions::CompMatFuncBase<3,_2>::doApply
          (IRet *__return_storage_ptr__,CompMatFuncBase<3,_2> *this,EvalContext *ctx,IArgs *iargs)

{
  IArgs *ctx_00;
  Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Vector<tcu::Interval,_3> *pVVar1;
  Interval *pIVar2;
  Interval *arg1;
  Void local_5e;
  Void local_5d [13];
  IRet local_50;
  int local_34;
  int local_30;
  int row;
  int col;
  IArgs *iargs_local;
  EvalContext *ctx_local;
  CompMatFuncBase<3,_2> *this_local;
  IRet *ret;
  
  row._3_1_ = 0;
  _col = iargs;
  iargs_local = (IArgs *)ctx;
  ctx_local = (EvalContext *)this;
  this_local = (CompMatFuncBase<3,_2> *)__return_storage_ptr__;
  tcu::Matrix<tcu::Interval,_3,_2>::Matrix(__return_storage_ptr__);
  for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      this_00 = (Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                 *)(**(code **)(*(long *)this + 0x58))();
      ctx_00 = iargs_local;
      pVVar1 = tcu::Matrix<tcu::Interval,_3,_2>::operator[](_col->a,local_30);
      pIVar2 = tcu::Vector<tcu::Interval,_3>::operator[](pVVar1,local_34);
      pVVar1 = tcu::Matrix<tcu::Interval,_3,_2>::operator[](_col->b,local_30);
      arg1 = tcu::Vector<tcu::Interval,_3>::operator[](pVVar1,local_34);
      Void::Void(local_5d);
      Void::Void(&local_5e);
      Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ::apply(&local_50,this_00,(EvalContext *)ctx_00,pIVar2,arg1,local_5d,&local_5e);
      pVVar1 = tcu::Matrix<tcu::Interval,_3,_2>::operator[](__return_storage_ptr__,local_30);
      pIVar2 = tcu::Vector<tcu::Interval,_3>::operator[](pVVar1,local_34);
      pIVar2->m_hasNaN = local_50.m_hasNaN;
      *(undefined7 *)&pIVar2->field_0x1 = local_50._1_7_;
      pIVar2->m_lo = local_50.m_lo;
      pIVar2->m_hi = local_50.m_hi;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet			ret;

		for (int col = 0; col < Cols; ++col)
		{
			for (int row = 0; row < Rows; ++row)
				ret[col][row] = this->doGetScalarFunc().apply(ctx,
															  iargs.a[col][row],
															  iargs.b[col][row]);
		}

		return ret;
	}